

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O2

bool __thiscall ON_SubDQuadNeighborhood::IsValid(ON_SubDQuadNeighborhood *this)

{
  ON_SubDEdge *(*papOVar1) [2];
  ON_SubDVertexTag OVar2;
  ON_SubDFace *this_00;
  ON_SubDFace *this_01;
  ON_SubDFace *pOVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  uint i;
  long lVar7;
  ON_SubDVertex *pOVar8;
  ON__UINT_PTR OVar9;
  ON_SubDFace *pOVar10;
  ON_SubDEdge *pOVar11;
  ON__UINT_PTR OVar12;
  ON_SubDEdge *pOVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  ON_SubDFace *pOVar17;
  uint i_00;
  uint i_01;
  int iVar18;
  ON_SubDEdge *(*papOVar19) [2];
  int *piVar20;
  ON_SubDEdge *(*papOVar21) [2];
  uint uVar22;
  uint uStack_1c0;
  uint side_fei [3];
  ON_SubDEdgePtr side_face_eptr;
  ON_SubDVertex *quad_vertex [4];
  ON_2dex grid_quad_vertex_dex [4];
  ON_SubDEdge *quad_edge [4];
  ON_SubDEdgePtr quad_eptr [4];
  ON_2dex grid_corner_dex [4];
  ON_2dex face_side_dex [4];
  ON_2dex face_corner_dex [4];
  ON_2dex grid_side_dex [4] [2];
  
  uVar15 = 0;
  for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
    uVar15 = uVar15 + this->m_bExtraordinaryCornerVertex[lVar7];
  }
  if (uVar15 == this->m_extraordinary_corner_vertex_count) {
    uVar15 = 0;
    for (lVar7 = -4; lVar7 != 0; lVar7 = lVar7 + 1) {
      if (this->m_bBoundaryCrease[lVar7 + -1] == true) {
        if (this->m_bExactQuadrantPatch[lVar7 + -1] == true) goto LAB_006183aa;
        uVar15 = uVar15 + 1;
      }
    }
    if (uVar15 == this->m_exact_quadrant_patch_count) {
      uVar15 = 0;
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        uVar15 = uVar15 + this->m_bBoundaryCrease[lVar7];
      }
      if (((uVar15 == this->m_boundary_crease_count) &&
          (this_00 = this->m_face_grid[1][1], this_00 != (ON_SubDFace *)0x0)) &&
         (this_00->m_edge_count == 4)) {
        lVar7 = 0;
        do {
          lVar14 = lVar7;
          uVar15 = (uint)lVar14;
          if ((uVar15 == 4) ||
             (pOVar8 = ON_SubDFace::Vertex(this_00,uVar15), pOVar8 == (ON_SubDVertex *)0x0))
          goto LAB_006183aa;
          lVar7 = lVar14 + 1;
        } while (this->m_vertex_grid[1][1] != pOVar8);
        uVar22 = (uint)(lVar14 + 1);
        pOVar8 = ON_SubDFace::Vertex(this_00,uVar22 & 3);
        if (pOVar8 != (ON_SubDVertex *)0x0) {
          if (this->m_vertex_grid[2][1] == pOVar8) {
            uStack_1c0 = 1;
          }
          else {
            if (this->m_vertex_grid[1][2] != pOVar8) goto LAB_006183aa;
            uStack_1c0 = 0xffffffff;
          }
          lVar7 = 0;
          ON_2dex::ON_2dex(face_corner_dex,0,0);
          ON_2dex::ON_2dex(face_corner_dex + 1,2,0);
          ON_2dex::ON_2dex(face_corner_dex + 2,2,2);
          ON_2dex::ON_2dex(face_corner_dex + 3,0,2);
          ON_2dex::ON_2dex(face_side_dex,1,0);
          ON_2dex::ON_2dex(face_side_dex + 1,2,1);
          ON_2dex::ON_2dex(face_side_dex + 2,1,2);
          ON_2dex::ON_2dex(face_side_dex + 3,0,1);
          ON_2dex::ON_2dex(grid_quad_vertex_dex,1,1);
          ON_2dex::ON_2dex(grid_quad_vertex_dex + 1,2,1);
          ON_2dex::ON_2dex(grid_quad_vertex_dex + 2,2,2);
          ON_2dex::ON_2dex(grid_quad_vertex_dex + 3,1,2);
          ON_2dex::ON_2dex(grid_corner_dex,0,0);
          ON_2dex::ON_2dex(grid_corner_dex + 1,3,0);
          ON_2dex::ON_2dex(grid_corner_dex + 2,3,3);
          ON_2dex::ON_2dex(grid_corner_dex + 3,0,3);
          ON_2dex::ON_2dex(grid_side_dex[0],1,0);
          ON_2dex::ON_2dex(grid_side_dex[0] + 1,2,0);
          ON_2dex::ON_2dex(grid_side_dex[1],3,1);
          ON_2dex::ON_2dex(grid_side_dex[1] + 1,3,2);
          ON_2dex::ON_2dex(grid_side_dex[2],2,3);
          ON_2dex::ON_2dex(grid_side_dex[2] + 1,1,3);
          ON_2dex::ON_2dex(grid_side_dex[3],0,2);
          ON_2dex::ON_2dex(grid_side_dex[3] + 1,0,1);
          i_01 = (uStack_1c0 + uVar22) - 1 & 3;
          i_00 = (int)(uVar22 + uStack_1c0 * 2 + 3) % 4;
          uVar22 = ~uStack_1c0 + uVar22 & 3;
          quad_vertex[0] = ON_SubDFace::Vertex(this_00,uVar15);
          quad_vertex[1] = ON_SubDFace::Vertex(this_00,i_01);
          quad_vertex[2] = ON_SubDFace::Vertex(this_00,i_00);
          quad_vertex[3] = ON_SubDFace::Vertex(this_00,uVar22);
          quad_eptr[0].m_ptr = this_00->m_edge4[lVar14].m_ptr;
          quad_eptr[1].m_ptr = this_00->m_edge4[i_01].m_ptr;
          quad_eptr[2].m_ptr = this_00->m_edge4[(int)i_00].m_ptr;
          quad_eptr[3].m_ptr = this_00->m_edge4[uVar22].m_ptr;
          quad_edge[0] = ON_SubDEdgePtr::Edge(quad_eptr);
          quad_edge[1] = ON_SubDEdgePtr::Edge(quad_eptr + 1);
          quad_edge[2] = ON_SubDEdgePtr::Edge(quad_eptr + 2);
          quad_edge[3] = ON_SubDEdgePtr::Edge(quad_eptr + 3);
          uVar15 = 1;
          do {
            if (lVar7 == 0x20) {
              papOVar1 = this->m_edge_grid;
              piVar20 = &grid_side_dex[0][0].j;
              lVar7 = 0;
              papOVar19 = papOVar1;
              goto LAB_006187b0;
            }
            lVar14 = *(long *)((long)quad_edge + lVar7);
            if ((((((lVar14 == 0) || (*(long *)(lVar14 + 0x80) == 0)) ||
                  (*(long *)(lVar14 + 0x88) == 0)) ||
                 (((*(short *)(lVar14 + 100) == 0 ||
                   (pOVar8 = *(ON_SubDVertex **)((long)quad_vertex + lVar7),
                   pOVar8 == (ON_SubDVertex *)0x0)) ||
                  ((pOVar8->m_edge_count < 2 ||
                   ((pOVar8->m_edges == (ON_SubDEdgePtr *)0x0 || (pOVar8->m_face_count == 0))))))))
                || (pOVar8->m_faces == (ON_SubDFace **)0x0)) ||
               ((pOVar8 != this->m_vertex_grid[*(int *)((long)&grid_quad_vertex_dex[0].i + lVar7)]
                           [*(int *)((long)&grid_quad_vertex_dex[0].j + lVar7)] ||
                (lVar14 != *(long *)((long)this->m_center_edges + lVar7))))) break;
            pOVar8 = quad_vertex[uVar15 & 3];
            OVar9 = ON_SubDEdgePtr::EdgeDirection
                              ((ON_SubDEdgePtr *)((long)&quad_eptr[0].m_ptr + lVar7));
            lVar7 = lVar7 + 8;
            uVar15 = uVar15 + 1;
          } while (pOVar8 == *(ON_SubDVertex **)(lVar14 + 0x80 + (1 - OVar9) * 8));
        }
      }
    }
  }
LAB_006183aa:
  ON_SubDIncrementErrorCount();
  return false;
LAB_006187b0:
  if (lVar7 == 4) {
    return true;
  }
  pOVar8 = quad_vertex[lVar7];
  if ((pOVar8 != this->m_vertex_grid[grid_quad_vertex_dex[lVar7].i][grid_quad_vertex_dex[lVar7].j])
     || (this_01 = this->m_face_grid[face_side_dex[lVar7].i][face_side_dex[lVar7].j],
        this_00 == this_01)) goto LAB_006183aa;
  if (this->m_bBoundaryCrease[lVar7] == true) {
    pOVar13 = quad_edge[lVar7];
    bVar6 = ON_SubDEdge::IsCrease(pOVar13);
    if ((((!bVar6) || (uVar15 = ON_SubDEdge::FaceArrayIndex(pOVar13,this_00), uVar15 == 0xffffffff))
        || ((pOVar13->m_face_count == 2 &&
            ((bVar6 = ON_SubDVertex::IsCreaseOrCorner(pOVar13->m_vertex[0]), !bVar6 ||
             (bVar6 = ON_SubDVertex::IsCreaseOrCorner(pOVar13->m_vertex[1]), !bVar6)))))) ||
       (this_01 != (ON_SubDFace *)0x0)) goto LAB_006183aa;
  }
  else {
    if ((this_01 == (ON_SubDFace *)0x0) || (pOVar13 = quad_edge[lVar7], pOVar13->m_face_count != 2))
    goto LAB_006183aa;
    bVar6 = ON_SubDEdge::IsCrease(pOVar13);
    if (bVar6) {
      OVar2 = pOVar13->m_vertex[0]->m_vertex_tag;
      iVar16 = 2;
      iVar18 = 0;
      if (OVar2 != Dart) {
        bVar6 = ON_SubDVertex::IsCreaseOrCorner(pOVar13->m_vertex[0]);
        iVar16 = 1;
        iVar18 = iVar16;
        if (!bVar6) goto LAB_006183aa;
      }
      if (pOVar13->m_vertex[1]->m_vertex_tag != Dart) {
        bVar6 = ON_SubDVertex::IsCreaseOrCorner(pOVar13->m_vertex[1]);
        if ((!bVar6) || (OVar2 != Dart)) goto LAB_006183aa;
        iVar18 = iVar18 + 1;
        iVar16 = 1;
      }
      if (iVar18 + iVar16 != 2) goto LAB_006183aa;
    }
    else {
      bVar6 = ON_SubDEdge::IsSmooth(pOVar13);
      if (!bVar6) goto LAB_006183aa;
    }
    pOVar10 = (ON_SubDFace *)(pOVar13->m_face2[0].m_ptr & 0xfffffffffffffff8);
    pOVar17 = (ON_SubDFace *)(pOVar13->m_face2[1].m_ptr & 0xfffffffffffffff8);
    pOVar3 = pOVar17;
    if ((((this_00 != pOVar10) && (pOVar3 = pOVar10, this_00 != pOVar17)) || (this_01 != pOVar3)) ||
       ((papOVar1[lVar7][0] == (ON_SubDEdge *)0x0 ||
        (papOVar21 = papOVar1 + lVar7, (*papOVar21)[1] == (ON_SubDEdge *)0x0)))) goto LAB_006183aa;
    side_fei[2] = 0;
    side_fei[0] = 0;
    side_fei[1] = 0;
    uVar15 = ON_SubDFace::EdgeArrayIndex(this_01,pOVar13);
    side_fei[1] = uVar15;
    if (uVar15 == 0xffffffff) goto LAB_006183aa;
    side_face_eptr = ON_SubDFace::EdgePtr(this_01,uVar15);
    pOVar11 = ON_SubDEdgePtr::Edge(&side_face_eptr);
    if (pOVar13 != pOVar11) goto LAB_006183aa;
    OVar9 = ON_SubDEdgePtr::EdgeDirection(&side_face_eptr);
    OVar12 = ON_SubDEdgePtr::EdgeDirection(quad_eptr + lVar7);
    uVar22 = (uint)this_01->m_edge_count;
    *(uint *)((long)side_fei + (ulong)((uint)(OVar9 == OVar12) << 3 ^ 8)) =
         ((uVar22 + uVar15) - 1) % uVar22;
    side_fei[(ulong)(OVar9 == OVar12) * 2] = (side_fei[1] + 1) % uVar22;
    pOVar13 = (*papOVar21)[0];
    pOVar11 = ON_SubDFace::Edge(this_01,side_fei[0]);
    if ((pOVar13 != pOVar11) ||
       (pOVar13 = (*papOVar21)[1], pOVar11 = ON_SubDFace::Edge(this_01,side_fei[2]),
       pOVar13 != pOVar11)) goto LAB_006183aa;
  }
  pOVar3 = this->m_face_grid[face_corner_dex[lVar7].i][face_corner_dex[lVar7].j];
  if (this_00 == pOVar3) goto LAB_006183aa;
  if (((pOVar8->m_edge_count == 4) && (pOVar8->m_face_count == 4)) &&
     (bVar6 = ON_SubDVertex::IsSmoothOrDart(pOVar8), bVar6)) {
    if (this->m_bBoundaryCrease[lVar7] != false) goto LAB_00618c58;
    if (this->m_bBoundaryCrease[(int)lVar7 - 1U & 3] == false) {
      for (uVar15 = 0; uVar15 != 4; uVar15 = uVar15 + 1) {
        pOVar13 = ON_SubDVertex::Edge(pOVar8,uVar15);
        if (pOVar13 == (ON_SubDEdge *)0x0) goto LAB_006183aa;
        if ((pOVar13->m_face_count != 2) ||
           ((bVar6 = ON_SubDEdge::IsSmooth(pOVar13), !bVar6 &&
            ((bVar6 = ON_SubDEdge::IsCrease(pOVar13), !bVar6 || (pOVar8->m_vertex_tag != Dart))))))
        {
          bVar6 = ON_SubDEdge::IsCrease(pOVar13);
          goto joined_r0x00618b93;
        }
      }
      if ((pOVar3 != (ON_SubDFace *)0x0) && (this_01 != pOVar3)) {
        iVar16 = grid_corner_dex[lVar7].i;
        iVar18 = grid_corner_dex[lVar7].j;
        uVar15 = ON_SubDFace::VertexIndex(pOVar3,pOVar8);
        if ((uVar15 != 0xffffffff) &&
           (uVar15 = ON_SubDFace::VertexIndex(pOVar3,pOVar8), uVar15 != 0xffffffff)) {
          pOVar8 = this->m_vertex_grid[iVar16][iVar18];
          if (pOVar3->m_edge_count == 4) {
            if (pOVar8 == (ON_SubDVertex *)0x0) goto LAB_006183aa;
            pOVar8 = ON_SubDFace::Vertex(pOVar3,uVar15 & 3 ^ 2);
            bVar6 = pOVar8 == this->m_vertex_grid[iVar16][iVar18];
          }
          else {
            bVar6 = pOVar8 == (ON_SubDVertex *)0x0;
          }
joined_r0x00618b93:
          if (bVar6) goto LAB_00618c50;
        }
      }
      goto LAB_006183aa;
    }
  }
LAB_00618c50:
  if (this->m_bBoundaryCrease[lVar7] == false) {
    lVar14 = 0;
    while (lVar14 != 2) {
      pOVar8 = quad_vertex[(int)lVar7 + (int)lVar14 & 3];
      pOVar13 = (*papOVar19)[lVar14];
      if ((pOVar8 != pOVar13->m_vertex[pOVar8 != pOVar13->m_vertex[0]]) ||
         (lVar4 = lVar14 * 2, lVar5 = lVar14 * 2, lVar14 = lVar14 + 1,
         this->m_vertex_grid[piVar20[lVar4 + -1]][piVar20[lVar5]] !=
         pOVar13->m_vertex[pOVar8 == pOVar13->m_vertex[0]])) goto LAB_006183aa;
    }
  }
LAB_00618c58:
  lVar7 = lVar7 + 1;
  papOVar19 = papOVar19 + 1;
  piVar20 = piVar20 + 4;
  goto LAB_006187b0;
}

Assistant:

bool ON_SubDQuadNeighborhood::IsValid() const
{
  unsigned int count = 0;
  for (unsigned int i = 0; i < 4; i++)
  {
    if (m_bExtraordinaryCornerVertex[i])
      count++;
  }
  if (count != m_extraordinary_corner_vertex_count)
    return ON_SUBD_RETURN_ERROR(false);

  count = 0;
  for (unsigned int i = 0; i < 4; i++)
  {
    if (m_bExactQuadrantPatch[i])
    {
      if (m_bExtraordinaryCornerVertex[i] )
        return ON_SUBD_RETURN_ERROR(false);
      count++;
    }
  }
  if (count != m_exact_quadrant_patch_count)
    return ON_SUBD_RETURN_ERROR(false);

  count = 0;
  for (unsigned int i = 0; i < 4; i++)
  {
    if (m_bBoundaryCrease[i])
    {
      //if ( m_bDartCrease[i] )
      //  return ON_SUBD_RETURN_ERROR(false);
      count++;
    }
  }
  if (count != m_boundary_crease_count)
    return ON_SUBD_RETURN_ERROR(false);

  //count = 0;
  //for (unsigned int i = 0; i < 4; i++)
  //{
  //  if (m_bDartCrease[i])
  //    count++;
  //}
  //if (count != m_dart_crease_count)
  //  return ON_SUBD_RETURN_ERROR(false);

  const ON_SubDFace* quad_face = m_face_grid[1][1];
  if (nullptr == quad_face || 4 != quad_face->m_edge_count)
    return ON_SUBD_RETURN_ERROR(false);

  int quad_fvi0 = 0;
  int quad_dir = 0;
  {
    for (quad_fvi0 = 0; quad_fvi0 < 4; quad_fvi0++)
    {
      const ON_SubDVertex* v = quad_face->Vertex(quad_fvi0);
      if ( nullptr == v )
        return ON_SUBD_RETURN_ERROR(false);
      if (m_vertex_grid[1][1] == v)
      {
        v = quad_face->Vertex((quad_fvi0+1)%4);
        if ( nullptr == v )
          return ON_SUBD_RETURN_ERROR(false);
        if (m_vertex_grid[2][1] == v)
          quad_dir = 1;
        else if (m_vertex_grid[1][2] == v)
          quad_dir = -1;
        else
          return ON_SUBD_RETURN_ERROR(false);
        break;
      }
    }
    if (0 == quad_dir || quad_fvi0 >= 4)
      return ON_SUBD_RETURN_ERROR(false);
  }

  const ON_2dex face_corner_dex[4] = { { 0, 0 }, { 2, 0 }, { 2, 2 }, { 0, 2 } };
  const ON_2dex face_side_dex[4] = { { 1, 0 }, { 2, 1 }, { 1, 2 }, { 0, 1 } };

  const ON_2dex grid_quad_vertex_dex[4] = { { 1,1 }, { 2,1 }, { 2,2 }, { 1,2 } };
  const ON_2dex grid_corner_dex[4] = { { 0, 0 }, { 3, 0 }, { 3, 3 }, { 0, 3 } };
  const ON_2dex grid_side_dex[4][2] = { {{ 1, 0 }, { 2, 0 }}, {{ 3, 1 }, { 3, 2 }}, {{ 2, 3 }, { 1, 3 }}, {{ 0, 2 }, { 0, 1 }} };

  ON_2dex dex;

  const int fvi_map[4] = {
    quad_fvi0,
    (quad_fvi0+4+quad_dir)%4,
    (quad_fvi0+4+2*quad_dir)%4,
    (quad_fvi0+4+3*quad_dir)%4};

  const ON_SubDVertex* quad_vertex[4] = {
    quad_face->Vertex(fvi_map[0]), 
    quad_face->Vertex(fvi_map[1]),
    quad_face->Vertex(fvi_map[2]),
    quad_face->Vertex(fvi_map[3]) };

  const ON_SubDEdgePtr quad_eptr[4] = {
    quad_face->m_edge4[fvi_map[0]],
    quad_face->m_edge4[fvi_map[1]], 
    quad_face->m_edge4[fvi_map[2]],
    quad_face->m_edge4[fvi_map[3]] };

  const ON_SubDEdge* quad_edge[4] = {
    quad_eptr[0].Edge(),
    quad_eptr[1].Edge(),
    quad_eptr[2].Edge(),
    quad_eptr[3].Edge() };

  for (unsigned int fi = 0; fi < 4; fi++)
  {
    if (nullptr == quad_edge[fi])
      return ON_SUBD_RETURN_ERROR(false);
    if (nullptr == quad_edge[fi]->m_vertex[0])
      return ON_SUBD_RETURN_ERROR(false);
    if (nullptr == quad_edge[fi]->m_vertex[1])
      return ON_SUBD_RETURN_ERROR(false);
    if (quad_edge[fi]->m_face_count < 1)
      return ON_SUBD_RETURN_ERROR(false);
    if (nullptr == quad_vertex[fi])
      return ON_SUBD_RETURN_ERROR(false);
    if (quad_vertex[fi]->m_edge_count < 2 || nullptr == quad_vertex[fi]->m_edges )
      return ON_SUBD_RETURN_ERROR(false);
    if (quad_vertex[fi]->m_face_count < 1 || nullptr == quad_vertex[fi]->m_faces )
      return ON_SUBD_RETURN_ERROR(false);
    dex = grid_quad_vertex_dex[fi];
    if ( quad_vertex[fi] != m_vertex_grid[dex.i][dex.j])
      return ON_SUBD_RETURN_ERROR(false);
    if ( quad_edge[fi] != m_center_edges[fi] )
      return ON_SUBD_RETURN_ERROR(false);
    if ( quad_vertex[(fi+1)%4] != quad_edge[fi]->m_vertex[1-quad_eptr[fi].EdgeDirection()] )
      return ON_SUBD_RETURN_ERROR(false);
  }
  
  const ON_SubDFace* side_face[4] = {};
  const ON_SubDFace* corner_face[4] = {};

  for (unsigned int fi = 0; fi < 4; fi++)
  {
    dex = grid_quad_vertex_dex[fi];
    if (quad_vertex[fi] != m_vertex_grid[dex.i][dex.j])
      return ON_SUBD_RETURN_ERROR(false);

    dex = face_side_dex[fi];
    side_face[fi] = m_face_grid[dex.i][dex.j];
    if ( quad_face == side_face[fi])
      return ON_SUBD_RETURN_ERROR(false);

    if (m_bBoundaryCrease[fi])
    {
      // A tag of ON_SubDEdgeTag::SmoothX is an error here
      if ( false == quad_edge[fi]->IsCrease() )
        return ON_SUBD_RETURN_ERROR(false);

      if ( ON_UNSET_UINT_INDEX == quad_edge[fi]->FaceArrayIndex(quad_face) )
        return ON_SUBD_RETURN_ERROR(false);

      if (2 == quad_edge[fi]->m_face_count)
      {
        if ( false == quad_edge[fi]->m_vertex[0]->IsCreaseOrCorner())
          return ON_SUBD_RETURN_ERROR(false);
        if ( false == quad_edge[fi]->m_vertex[1]->IsCreaseOrCorner())
          return ON_SUBD_RETURN_ERROR(false);
      }

      if (nullptr != side_face[fi])
        return ON_SUBD_RETURN_ERROR(false);
    }
    else
    {
      if (nullptr == side_face[fi])
        return ON_SUBD_RETURN_ERROR(false);

      // A tag of ON_SubDEdgeTag::SmoothX is permitted here
      if ( 2 != quad_edge[fi]->m_face_count)
        return ON_SUBD_RETURN_ERROR(false);

      if (quad_edge[fi]->IsCrease())
      {
        unsigned int dart_count = 0;
        unsigned int crease_count = 0;
        if ( ON_SubDVertexTag::Dart == quad_edge[fi]->m_vertex[0]->m_vertex_tag)
          dart_count++;
        else if ( quad_edge[fi]->m_vertex[0]->IsCreaseOrCorner())
          crease_count++;
        else
          return ON_SUBD_RETURN_ERROR(false);

        if ( ON_SubDVertexTag::Dart == quad_edge[fi]->m_vertex[1]->m_vertex_tag)
          dart_count++;
        else if ( quad_edge[fi]->m_vertex[1]->IsCreaseOrCorner())
          crease_count++;
        else
          return ON_SUBD_RETURN_ERROR(false);

        if ( 0 == dart_count )
          return ON_SUBD_RETURN_ERROR(false);

        if ( 2 != dart_count + crease_count )
          return ON_SUBD_RETURN_ERROR(false);
      }
      else
      {
        if (false == quad_edge[fi]->IsSmooth())
          return ON_SUBD_RETURN_ERROR(false);
      }
      const ON_SubDFace* edge_faces[2] = { ON_SUBD_FACE_POINTER(quad_edge[fi]->m_face2[0].m_ptr), ON_SUBD_FACE_POINTER(quad_edge[fi]->m_face2[1].m_ptr) };
      if (quad_face == edge_faces[0])
      {
        if (side_face[fi] != edge_faces[1])
          return ON_SUBD_RETURN_ERROR(false);
      }
      else if (quad_face == edge_faces[1])
      {
        if (side_face[fi] != edge_faces[0])
          return ON_SUBD_RETURN_ERROR(false);
      }
      else
        return ON_SUBD_RETURN_ERROR(false);

      if (nullptr == m_edge_grid[fi][0] || nullptr == m_edge_grid[fi][1])
        return ON_SUBD_RETURN_ERROR(false);

      unsigned int side_fei[3] = {};
      side_fei[1] = side_face[fi]->EdgeArrayIndex(quad_edge[fi]);
      if ( ON_UNSET_UINT_INDEX == side_fei[1] )
        return ON_SUBD_RETURN_ERROR(false);

      const ON_SubDEdgePtr side_face_eptr = side_face[fi]->EdgePtr(side_fei[1]);
      if ( quad_edge[fi] != side_face_eptr.Edge())
        return ON_SUBD_RETURN_ERROR(false);

      unsigned int k = (side_face_eptr.EdgeDirection() == quad_eptr[fi].EdgeDirection()) ? 2 : 0;
      unsigned int side_face_edge_count = side_face[fi]->m_edge_count;
      side_fei[2-k] = (side_fei[1] + side_face_edge_count - 1) % side_face_edge_count;
      side_fei[k] = (side_fei[1] + 1) % side_face_edge_count;
      if ( m_edge_grid[fi][0] != side_face[fi]->Edge(side_fei[0]))
        return ON_SUBD_RETURN_ERROR(false);
      if ( m_edge_grid[fi][1] != side_face[fi]->Edge(side_fei[2]))
        return ON_SUBD_RETURN_ERROR(false);
    }

    dex = face_corner_dex[fi];
    corner_face[fi] = m_face_grid[dex.i][dex.j];
    if ( quad_face == corner_face[fi])
      return ON_SUBD_RETURN_ERROR(false);

    bool bCornerShouldExist 
      = 4 == quad_vertex[fi]->m_edge_count
      && 4 == quad_vertex[fi]->m_face_count
      && quad_vertex[fi]->IsSmoothOrDart()
      && false == m_bBoundaryCrease[fi]
      && false == m_bBoundaryCrease[(fi + 3) % 4];
    if (bCornerShouldExist)
    {
      for (unsigned int vei = 0; vei < 4; vei++)
      {
        const ON_SubDEdge* e = quad_vertex[fi]->Edge(vei);
        if ( nullptr == e)
          return ON_SUBD_RETURN_ERROR(false);
        if (2 == e->m_face_count)
        {
          if (e->IsSmooth())
            continue;
          if (e->IsCrease() && ON_SubDVertexTag::Dart == quad_vertex[fi]->m_vertex_tag)
            continue;
        }
        if (false == e->IsCrease())
          return ON_SUBD_RETURN_ERROR(false);
        bCornerShouldExist = false;
        break;
      }
    }

    dex = grid_corner_dex[fi];
    if (bCornerShouldExist)
    {
      if (nullptr == corner_face[fi])
        return ON_SUBD_RETURN_ERROR(false);
      if (side_face[fi] == corner_face[fi])
        return ON_SUBD_RETURN_ERROR(false);
      if (ON_UNSET_UINT_INDEX == corner_face[fi]->VertexIndex(quad_vertex[fi]))
        return ON_SUBD_RETURN_ERROR(false);
      const unsigned int corner_face_vi = corner_face[fi]->VertexIndex(quad_vertex[fi]);
      if ( ON_UNSET_UINT_INDEX == corner_face_vi)
        return ON_SUBD_RETURN_ERROR(false);
      if (4 == corner_face[fi]->m_edge_count)
      {
        if (nullptr == m_vertex_grid[dex.i][dex.j])
          return ON_SUBD_RETURN_ERROR(false);
        if ( corner_face[fi]->Vertex((corner_face_vi+2)%4) != m_vertex_grid[dex.i][dex.j] )
          return ON_SUBD_RETURN_ERROR(false);
      }
      else
      {
        if (nullptr != m_vertex_grid[dex.i][dex.j])
          return ON_SUBD_RETURN_ERROR(false);
      }
    }
    //else 
    //{
    //  if (nullptr != corner_face[fi])
    //    return ON_SUBD_RETURN_ERROR(false);
    //  if (nullptr != m_vertex_grid[dex.i][dex.j])
    //    return ON_SUBD_RETURN_ERROR(false);
    //}

    if (false == m_bBoundaryCrease[fi])
    {
      for (unsigned int j = 0; j < 2; j++)
      {
        const ON_SubDVertex* v = quad_vertex[(fi + j) % 4];
        unsigned int k = (v != m_edge_grid[fi][j]->m_vertex[0]) ? 0 : 1;
        if (v != m_edge_grid[fi][j]->m_vertex[1 - k])
          return ON_SUBD_RETURN_ERROR(false);
        dex = grid_side_dex[fi][j];
        if (m_vertex_grid[dex.i][dex.j] != m_edge_grid[fi][j]->m_vertex[k])
          return ON_SUBD_RETURN_ERROR(false);
      }
    }
  }

  return true;
}